

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

bool __thiscall lsh::vector::get(vector *this,uint i)

{
  uint uVar1;
  int iVar2;
  out_of_range *this_00;
  const_reference pvVar3;
  char local_4c;
  uint b;
  uint j;
  uint d;
  uint c;
  uint s;
  uint i_local;
  vector *this_local;
  
  uVar1 = this->size_;
  if (uVar1 <= i) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Invalid index");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar2 = (i / uVar1) * uVar1;
  if (uVar1 < iVar2 + 0x20U) {
    local_4c = (char)uVar1 - (char)iVar2;
  }
  else {
    local_4c = '\0';
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->components_,(ulong)(i / uVar1));
  return (*pvVar3 >> ((local_4c - (char)(i % uVar1)) - 1U & 0x1f) & 1) != 0;
}

Assistant:

bool vector::get(unsigned int i) const {
    unsigned int s = this->size_;
    unsigned int c = this->chunk_size_;

    if (i >= s) {
      throw std::out_of_range("Invalid index");
    }

    // Compute the index of the target chunk.
    unsigned int d = i / s;

    // Compute the index of the first bit of the target chunk.
    unsigned int j = d * s;

    // Compute the number of bits in the target chunk.
    unsigned int b = j + c > s ? s - j : c;

    return (this->components_[d] >> (b - (i % s) - 1)) & 1;
  }